

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:118:36)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:118:36)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  gc_heap *h;
  gc_heap_ptr_untyped gStack_28;
  string_view local_18;
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  h = (this->f).h;
  if (v == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    local_18._M_len = 0;
    local_18._M_str = "";
    string::string((string *)&gStack_28,h,&local_18);
  }
  else {
    to_string((mjs *)&gStack_28,h,v);
  }
  value::value(__return_storage_ptr__,(string *)&gStack_28);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_28);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }